

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O0

void complex_multiply_add(float *dst,float *l,float *r,uint32_t size)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float im;
  float re;
  float imB;
  float reB;
  float imA;
  float reA;
  uint32_t k;
  uint32_t size_local;
  float *r_local;
  float *l_local;
  float *dst_local;
  
  for (imA = 0.0; (uint)imA < size; imA = (float)((int)imA + 2)) {
    fVar1 = l[(uint)imA];
    fVar2 = l[(int)imA + 1];
    fVar3 = r[(uint)imA];
    fVar4 = r[(int)imA + 1];
    dst[(uint)imA] = fVar1 * fVar3 + -(fVar2 * fVar4) + dst[(uint)imA];
    dst[(int)imA + 1U] = fVar1 * fVar4 + fVar2 * fVar3 + dst[(int)imA + 1U];
  }
  return;
}

Assistant:

VECTORIZE void complex_multiply_add(float *restrict dst, float *restrict l, float *restrict r, uint32_t size){
  for(uint32_t k = 0; k < size; k+= 2){
    float reA = l[k+0];
    float imA = l[k+1];
    float reB = r[k+0];
    float imB = r[k+1];

    float re = reA * reB - imA * imB;
    float im = reA * imB + imA * reB;

    dst[k+0] += re;
    dst[k+1] += im;
  }
}